

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lf_heter_queue.h
# Opt level: O1

void __thiscall
density::
lf_heter_queue<density::detail::FunctionRuntimeType<(density::function_type_erasure)0,_void_()>,_density::basic_default_allocator<65536UL>,_(density::concurrency_cardinality)1,_(density::concurrency_cardinality)1,_(density::consistency_model)1>
::consume_operation::~consume_operation(consume_operation *this)

{
  ControlBlock *i_address;
  bool bVar1;
  
  bVar1 = detail::
          LFQueue_Head<density::detail::FunctionRuntimeType<(density::function_type_erasure)0,_void_()>,_density::basic_default_allocator<65536UL>,_(density::concurrency_cardinality)1,_density::detail::LFQueue_Tail<density::detail::FunctionRuntimeType<(density::function_type_erasure)0,_void_()>,_density::basic_default_allocator<65536UL>,_(density::concurrency_cardinality)1,_(density::consistency_model)1>_>
          ::Consume::empty(&this->m_consume_data);
  if (!bVar1) {
    LOCK();
    ((this->m_consume_data).m_control)->m_next = (this->m_consume_data).m_next_ptr - 2;
    UNLOCK();
    (this->m_consume_data).m_next_ptr = 0;
  }
  i_address = (this->m_consume_data).m_control;
  if (i_address != (ControlBlock *)0x0) {
    detail::PageAllocator<density::detail::SystemPageManager<65536UL>_>::unpin_page(i_address);
    return;
  }
  return;
}

Assistant:

~consume_operation()
            {
                if (!m_consume_data.empty())
                {
                    m_consume_data.cancel_consume_impl();
                }
            }